

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Errors.cpp
# Opt level: O1

void __thiscall Refal2::CError::ResetMessage(CError *this)

{
  (this->message)._M_string_length = 0;
  *(this->message)._M_dataplus._M_p = '\0';
  (this->userMessage)._M_string_length = 0;
  *(this->userMessage)._M_dataplus._M_p = '\0';
  return;
}

Assistant:

void CError::ResetMessage()
{
	message.clear();
	resetCache();
}